

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGui::FindWindowFocusIndex(ImGuiWindow *window)

{
  uint uVar1;
  
  if (window->RootWindow != window) {
    __assert_fail("window->RootWindow == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2905,"int ImGui::FindWindowFocusIndex(ImGuiWindow *)");
  }
  uVar1 = (uint)window->FocusOrder;
  if ((-1 < window->FocusOrder) && ((int)uVar1 < (GImGui->WindowsFocusOrder).Size)) {
    if ((GImGui->WindowsFocusOrder).Data[uVar1] == window) {
      return uVar1;
    }
    __assert_fail("g.WindowsFocusOrder[order] == window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x2906,"int ImGui::FindWindowFocusIndex(ImGuiWindow *)");
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
}

Assistant:

static int ImGui::FindWindowFocusIndex(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(g);
    int order = window->FocusOrder;
    IM_ASSERT(window->RootWindow == window); // No child window (not testing _ChildWindow because of docking)
    IM_ASSERT(g.WindowsFocusOrder[order] == window);
    return order;
}